

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::RemoveAddedNode(CConnman *this,string *strNode)

{
  long lVar1;
  const_iterator __position;
  bool bVar2;
  __type_conflict _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock88;
  Mutex *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  __normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
  *in_stack_ffffffffffffff78;
  vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *this_00;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffa8;
  bool local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::begin
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  do {
    std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::end
              ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar2 = __gnu_cxx::
            operator==<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                      (in_stack_ffffffffffffff78,
                       (__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_31 = false;
LAB_0021f3fd:
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_31;
      }
      __stack_chk_fail();
    }
    __gnu_cxx::
    __normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
    ::operator->((__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                  *)in_stack_ffffffffffffff68);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI);
    if (_Var3) {
      this_00 = (vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                ((long)&in_RDI[9].field_2 + 8);
      __gnu_cxx::
      __normal_iterator<AddedNodeParams_const*,std::vector<AddedNodeParams,std::allocator<AddedNodeParams>>>
      ::__normal_iterator<AddedNodeParams*>
                ((__normal_iterator<const_AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                  *)this_00,
                 (__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      __position._M_current._4_4_ = in_stack_ffffffffffffff9c;
      __position._M_current._0_4_ = in_stack_ffffffffffffff98;
      std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::erase(this_00,__position);
      local_31 = true;
      goto LAB_0021f3fd;
    }
    __gnu_cxx::
    __normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
    ::operator++((__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                  *)in_stack_ffffffffffffff68);
  } while( true );
}

Assistant:

bool CConnman::RemoveAddedNode(const std::string& strNode)
{
    LOCK(m_added_nodes_mutex);
    for (auto it = m_added_node_params.begin(); it != m_added_node_params.end(); ++it) {
        if (strNode == it->m_added_node) {
            m_added_node_params.erase(it);
            return true;
        }
    }
    return false;
}